

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O1

cmSourceGroup * __thiscall cmSourceGroup::MatchChildrenFiles(cmSourceGroup *this,string *name)

{
  cmSourceGroupInternals *pcVar1;
  cmSourceGroup *pcVar2;
  const_iterator cVar3;
  cmSourceGroup *pcVar4;
  cmSourceGroup *group;
  cmSourceGroup *this_00;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->GroupFiles)._M_t,name);
  if ((_Rb_tree_header *)cVar3._M_node == &(this->GroupFiles)._M_t._M_impl.super__Rb_tree_header) {
    pcVar1 = (this->Internal)._M_t.
             super___uniq_ptr_impl<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmSourceGroupInternals_*,_std::default_delete<cmSourceGroupInternals>_>
             .super__Head_base<0UL,_cmSourceGroupInternals_*,_false>._M_head_impl;
    pcVar2 = *(pointer *)
              ((long)&(pcVar1->GroupChildren).
                      super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_> + 8);
    for (this_00 = *(cmSourceGroup **)
                    &(pcVar1->GroupChildren).
                     super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>;
        this_00 != pcVar2; this_00 = this_00 + 1) {
      pcVar4 = MatchChildrenFiles(this_00,name);
      if (pcVar4 != (cmSourceGroup *)0x0) {
        return pcVar4;
      }
    }
    this = (cmSourceGroup *)0x0;
  }
  return this;
}

Assistant:

const cmSourceGroup* cmSourceGroup::MatchChildrenFiles(
  const std::string& name) const
{
  if (this->MatchesFiles(name)) {
    return this;
  }
  for (const cmSourceGroup& group : this->Internal->GroupChildren) {
    const cmSourceGroup* result = group.MatchChildrenFiles(name);
    if (result) {
      return result;
    }
  }
  return nullptr;
}